

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

bool __thiscall kj::_::NetworkFilter::shouldAllow(NetworkFilter *this,sockaddr *addr,uint addrlen)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  CidrRange *pCVar6;
  NetworkFilter *pNVar7;
  NetworkFilter *n;
  CidrRange *cidr_1;
  CidrRange *__end2_1;
  CidrRange *__begin2_1;
  Vector<kj::_::CidrRange> *__range2_1;
  CidrRange *local_78;
  CidrRange *cidr;
  CidrRange *__end2;
  CidrRange *__begin2;
  Vector<kj::_::CidrRange> *__range2;
  uint allowSpecificity;
  bool allowed;
  ArrayPtr<const_char> path;
  Fault local_30;
  Fault f;
  uint addrlen_local;
  sockaddr *addr_local;
  NetworkFilter *this_local;
  
  f.exception._4_4_ = addrlen;
  if (addrlen < 2) {
    Debug::Fault::Fault(&local_30,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
                        ,0x8c3,FAILED,"addrlen >= sizeof(addr->sa_family)","");
    Debug::Fault::fatal(&local_30);
  }
  if (addr->sa_family == 1) {
    _allowSpecificity = safeUnixPath((sockaddr_un *)addr,addrlen);
    sVar4 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)&allowSpecificity);
    if ((sVar4 == 0) ||
       (pcVar5 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)&allowSpecificity,0),
       *pcVar5 != '\0')) {
      this_local._7_1_ = (bool)(this->allowUnix & 1);
    }
    else {
      this_local._7_1_ = (bool)(this->allowAbstractUnix & 1);
    }
  }
  else {
    __range2._7_1_ = 0;
    __range2._0_4_ = 0;
    __begin2 = (CidrRange *)&this->allowCidrs;
    __end2 = Vector<kj::_::CidrRange>::begin((Vector<kj::_::CidrRange> *)__begin2);
    cidr = Vector<kj::_::CidrRange>::end((Vector<kj::_::CidrRange> *)__begin2);
    for (; __end2 != cidr; __end2 = __end2 + 1) {
      local_78 = __end2;
      bVar1 = CidrRange::matches(__end2,addr);
      if (bVar1) {
        __range2_1._4_4_ = CidrRange::getSpecificity(local_78);
        __range2._0_4_ =
             max<unsigned_int&,unsigned_int>((uint *)&__range2,(uint *)((long)&__range2_1 + 4));
        __range2._7_1_ = 1;
      }
    }
    if ((__range2._7_1_ & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      __end2_1 = Vector<kj::_::CidrRange>::begin(&this->denyCidrs);
      pCVar6 = Vector<kj::_::CidrRange>::end(&this->denyCidrs);
      for (; __end2_1 != pCVar6; __end2_1 = __end2_1 + 1) {
        bVar1 = CidrRange::matches(__end2_1,addr);
        if ((bVar1) &&
           (uVar2 = CidrRange::getSpecificity(__end2_1),
           (WiderType<Decay<unsigned_int_&>,_Decay<unsigned_int>_>)__range2 <= uVar2)) {
          return false;
        }
      }
      pNVar7 = readMaybe<kj::_::NetworkFilter>(&this->next);
      if (pNVar7 == (NetworkFilter *)0x0) {
        this_local._7_1_ = true;
      }
      else {
        iVar3 = (**(pNVar7->super_NetworkFilter)._vptr_NetworkFilter)
                          (pNVar7,addr,(ulong)f.exception._4_4_);
        this_local._7_1_ = (bool)((byte)iVar3 & 1);
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool NetworkFilter::shouldAllow(const struct sockaddr* addr, uint addrlen) {
  KJ_REQUIRE(addrlen >= sizeof(addr->sa_family));

#if !_WIN32
  if (addr->sa_family == AF_UNIX) {
    auto path = safeUnixPath(reinterpret_cast<const struct sockaddr_un*>(addr), addrlen);
    if (path.size() > 0 && path[0] == '\0') {
      return allowAbstractUnix;
    } else {
      return allowUnix;
    }
  }
#endif

  bool allowed = false;
  uint allowSpecificity = 0;
  for (auto& cidr: allowCidrs) {
    if (cidr.matches(addr)) {
      allowSpecificity = kj::max(allowSpecificity, cidr.getSpecificity());
      allowed = true;
    }
  }
  if (!allowed) return false;
  for (auto& cidr: denyCidrs) {
    if (cidr.matches(addr)) {
      if (cidr.getSpecificity() >= allowSpecificity) return false;
    }
  }

  KJ_IF_MAYBE(n, next) {
    return n->shouldAllow(addr, addrlen);
  } else {
    return true;
  }
}